

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
::sort_columns(persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
               *this)

{
  deque<filtration_index_t,_std::allocator<filtration_index_t>_> *in_RDI;
  undefined1 local_48 [32];
  undefined1 local_28 [40];
  
  std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::begin(in_RDI);
  std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::end(in_RDI);
  std::
  sort<std::_Deque_iterator<filtration_index_t,filtration_index_t&,filtration_index_t*>,greater_filtration_or_smaller_index<filtration_index_t>>
            (local_28,local_48);
  return;
}

Assistant:

void sort_columns() {
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "sorting " << columns_to_reduce.size() << " columns" << std::flush << "\r";
#endif

#ifdef SORT_COLUMNS_BY_PIVOT
		std_algorithms::sort(
		    columns_to_reduce.begin(), columns_to_reduce.end(),
		    greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t, decltype(complex)>(complex));
#else
		std_algorithms::sort(columns_to_reduce.begin(), columns_to_reduce.end(),
		                     greater_filtration_or_smaller_index<filtration_index_t>());
#endif
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K";
#endif
	}